

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void ecs_enable_system(ecs_world_t *world,ecs_entity_t system,EcsSystem *system_data,_Bool enabled)

{
  ecs_query_t *query_00;
  int32_t iVar1;
  ecs_system_status_t status;
  ecs_query_t *query;
  EcsSystem *pEStack_20;
  _Bool enabled_local;
  EcsSystem *system_data_local;
  ecs_entity_t system_local;
  ecs_world_t *world_local;
  
  _ecs_assert((_Bool)((world->in_progress ^ 0xffU) & 1),0xc,(char *)0x0,"!world->in_progress",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
              ,0xc6);
  if ((world->in_progress & 1U) != 0) {
    __assert_fail("!world->in_progress",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0xc6,"void ecs_enable_system(ecs_world_t *, ecs_entity_t, EcsSystem *, _Bool)");
  }
  query_00 = system_data->query;
  if (query_00 != (ecs_query_t *)0x0) {
    iVar1 = ecs_vector_count(query_00->tables);
    pEStack_20 = system_data;
    if (iVar1 != 0) {
      ecs_system_activate(world,system,enabled,system_data);
      pEStack_20 = (EcsSystem *)ecs_get_mut_w_entity(world,system,5,(_Bool *)0x0);
    }
    activate_in_columns(world,query_00,world->on_enable_components,enabled);
    status = EcsSystemDisabled;
    if (enabled) {
      status = EcsSystemEnabled;
    }
    invoke_status_action(world,system,pEStack_20,status);
  }
  return;
}

Assistant:

static
void ecs_enable_system(
    ecs_world_t *world,
    ecs_entity_t system,
    EcsSystem *system_data,
    bool enabled)
{
    ecs_assert(!world->in_progress, ECS_INTERNAL_ERROR, NULL);

    ecs_query_t *query = system_data->query;
    if (!query) {
        return;
    }

    if (ecs_vector_count(query->tables)) {
        /* Only (de)activate system if it has non-empty tables. */
        ecs_system_activate(world, system, enabled, system_data);
        system_data = ecs_get_mut(world, system, EcsSystem, NULL);
    }

    /* Enable/disable systems that trigger on [in] enablement */
    activate_in_columns(
        world, 
        query, 
        world->on_enable_components, 
        enabled);
    
    /* Invoke action for enable/disable status */
    invoke_status_action(
        world, system, system_data,
        enabled ? EcsSystemEnabled : EcsSystemDisabled);
}